

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::read_pixel
          (Image *this,ssize_t x,ssize_t y,uint64_t *r,uint64_t *g,uint64_t *b,uint64_t *a)

{
  out_of_range *this_00;
  logic_error *this_01;
  long lVar1;
  int iVar2;
  uint64_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  size_t index;
  uint64_t *b_local;
  uint64_t *g_local;
  uint64_t *r_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *this_local;
  
  if ((((-1 < x) && (-1 < y)) && (x < this->width)) && (y < this->height)) {
    iVar2 = 3;
    if ((this->has_alpha & 1U) != 0) {
      iVar2 = 4;
    }
    lVar1 = (y * this->width + x) * (long)iVar2;
    if (this->channel_width == '\b') {
      if (r != (uint64_t *)0x0) {
        *r = (ulong)*(byte *)((long)(this->data).raw + lVar1);
      }
      if (g != (uint64_t *)0x0) {
        *g = (ulong)*(byte *)((long)(this->data).raw + lVar1 + 1);
      }
      if (b != (uint64_t *)0x0) {
        *b = (ulong)*(byte *)((long)(this->data).raw + lVar1 + 2);
      }
      if (a != (uint64_t *)0x0) {
        if ((this->has_alpha & 1U) == 0) {
          local_68 = this->max_value;
        }
        else {
          local_68 = (ulong)*(byte *)((long)(this->data).raw + lVar1 + 3);
        }
        *a = local_68;
      }
    }
    else if (this->channel_width == '\x10') {
      if (r != (uint64_t *)0x0) {
        *r = (ulong)*(ushort *)((long)(this->data).raw + lVar1 * 2);
      }
      if (g != (uint64_t *)0x0) {
        *g = (ulong)*(ushort *)((long)(this->data).raw + lVar1 * 2 + 2);
      }
      if (b != (uint64_t *)0x0) {
        *b = (ulong)*(ushort *)((long)(this->data).raw + lVar1 * 2 + 4);
      }
      if (a != (uint64_t *)0x0) {
        if ((this->has_alpha & 1U) == 0) {
          local_70 = this->max_value;
        }
        else {
          local_70 = (ulong)*(ushort *)((long)(this->data).raw + lVar1 * 2 + 6);
        }
        *a = local_70;
      }
    }
    else if (this->channel_width == ' ') {
      if (r != (uint64_t *)0x0) {
        *r = (ulong)*(uint *)((long)(this->data).raw + lVar1 * 4);
      }
      if (g != (uint64_t *)0x0) {
        *g = (ulong)*(uint *)((long)(this->data).raw + lVar1 * 4 + 4);
      }
      if (b != (uint64_t *)0x0) {
        *b = (ulong)*(uint *)((long)(this->data).raw + lVar1 * 4 + 8);
      }
      if (a != (uint64_t *)0x0) {
        if ((this->has_alpha & 1U) == 0) {
          local_78 = this->max_value;
        }
        else {
          local_78 = (ulong)*(uint *)((long)(this->data).raw + lVar1 * 4 + 0xc);
        }
        *a = local_78;
      }
    }
    else {
      if (this->channel_width != '@') {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error(this_01,"image channel width is not 8, 16, 32, or 64");
        __cxa_throw(this_01,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      if (r != (uint64_t *)0x0) {
        *r = *(uint64_t *)((long)(this->data).raw + lVar1 * 8);
      }
      if (g != (uint64_t *)0x0) {
        *g = *(uint64_t *)((long)(this->data).raw + lVar1 * 8 + 8);
      }
      if (b != (uint64_t *)0x0) {
        *b = *(uint64_t *)((long)(this->data).raw + lVar1 * 8 + 0x10);
      }
      if (a != (uint64_t *)0x0) {
        if ((this->has_alpha & 1U) == 0) {
          local_80 = this->max_value;
        }
        else {
          local_80 = *(uint64_t *)((long)(this->data).raw + lVar1 * 8 + 0x18);
        }
        *a = local_80;
      }
    }
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"out of bounds");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

void Image::read_pixel(ssize_t x, ssize_t y, uint64_t* r, uint64_t* g,
    uint64_t* b, uint64_t* a) const {

  // check coordinates
  if (x < 0 || y < 0 || x >= this->width || y >= this->height) {
    throw out_of_range("out of bounds");
  }

  size_t index = (y * this->width + x) * (this->has_alpha ? 4 : 3);
  if (this->channel_width == 8) {
    if (r) {
      *r = this->data.as8[index];
    }
    if (g) {
      *g = this->data.as8[index + 1];
    }
    if (b) {
      *b = this->data.as8[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as8[index + 3] : this->max_value;
    }
  } else if (this->channel_width == 16) {
    if (r) {
      *r = this->data.as16[index];
    }
    if (g) {
      *g = this->data.as16[index + 1];
    }
    if (b) {
      *b = this->data.as16[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as16[index + 3] : this->max_value;
    }
  } else if (this->channel_width == 32) {
    if (r) {
      *r = this->data.as32[index];
    }
    if (g) {
      *g = this->data.as32[index + 1];
    }
    if (b) {
      *b = this->data.as32[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as32[index + 3] : this->max_value;
    }
  } else if (this->channel_width == 64) {
    if (r) {
      *r = this->data.as64[index];
    }
    if (g) {
      *g = this->data.as64[index + 1];
    }
    if (b) {
      *b = this->data.as64[index + 2];
    }
    if (a) {
      *a = this->has_alpha ? this->data.as64[index + 3] : this->max_value;
    }
  } else {
    throw logic_error("image channel width is not 8, 16, 32, or 64");
  }
}